

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall Matrix::Matrix(Matrix *this)

{
  int *piVar1;
  allocator<char> local_11;
  Matrix *local_10;
  Matrix *this_local;
  
  local_10 = this;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->sMatrixName,"data",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->nMatrixDimension = 0;
  piVar1 = (int *)operator_new__(4);
  this->pSize = piVar1;
  *this->pSize = 1;
  this->bReference = false;
  init(this,(EVP_PKEY_CTX *)0x1);
  *this->pData = 0.0;
  return;
}

Assistant:

Matrix::Matrix() : sMatrixName("data") 
{ 
	nMatrixDimension = 0;
	pSize = new int[1];
	pSize[0] = 1;
	bReference = false;
	init();
	pData[0] = 0.0;
}